

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O2

void al_set_standard_fs_interface(void)

{
  al_set_fs_interface(&_al_fs_interface_stdio);
  return;
}

Assistant:

void al_set_standard_fs_interface(void)
{
   al_set_fs_interface(&_al_fs_interface_stdio);
}